

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_FormatNumber
              (RecyclableObject *function,CallInfo callInfo,...)

{
  int iVar1;
  int iVar2;
  ScriptContext *scriptContext;
  code *pcVar3;
  FinalizableUNumberFormat *pFVar4;
  bool bVar5;
  int iVar6;
  UNumberFormatFields field;
  charcount_t cVar7;
  charcount_t cVar8;
  undefined4 *puVar9;
  Var pvVar10;
  DynamicObject *pDVar11;
  JavascriptBoolean *pJVar12;
  JavascriptArray *pJVar13;
  Recycler *pRVar14;
  UChar *pUVar15;
  Recycler *pRVar16;
  LPCSTR pCVar17;
  JavascriptString *pJVar18;
  uint uVar19;
  uint in_stack_00000010;
  undefined1 local_b8 [8];
  NumberFormatPartsBuilder nfpb;
  undefined1 auStack_88 [4];
  UErrorCode status;
  int partStart;
  ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70> *local_78;
  undefined1 local_70 [8];
  Arguments args;
  Var cachedUNumberFormat;
  double num;
  FinalizableUNumberFormat *fmt;
  ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70> local_40;
  ScopedUFieldPositionIterator fpi;
  int partEnd;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  uVar19 = callInfo._0_4_;
  if (in_stack_00000010 != uVar19) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x958,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00a2bf64;
    *puVar9 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  local_70 = (undefined1  [8])callInfo;
  if ((uVar19 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x958,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) goto LAB_00a2bf64;
    *puVar9 = 0;
  }
  fmt = (FinalizableUNumberFormat *)
        (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
        scriptContext.ptr;
  if ((uVar19 & 0xffffff) == 5) {
    pvVar10 = Arguments::operator[]((Arguments *)local_70,1);
    bVar5 = TaggedInt::Is(pvVar10);
    if ((!bVar5) &&
       (pvVar10 = Arguments::operator[]((Arguments *)local_70,1), (ulong)pvVar10 >> 0x32 == 0))
    goto LAB_00a2b71e;
    pvVar10 = Arguments::operator[]((Arguments *)local_70,2);
    bVar5 = DynamicObject::IsBaseDynamicObject(pvVar10);
    if (!bVar5) goto LAB_00a2b71e;
    pvVar10 = Arguments::operator[]((Arguments *)local_70,3);
    bVar5 = VarIs<Js::JavascriptBoolean>(pvVar10);
    if (!bVar5) goto LAB_00a2b71e;
    pvVar10 = Arguments::operator[]((Arguments *)local_70,4);
    bVar5 = VarIs<Js::JavascriptBoolean>(pvVar10);
    if (!bVar5) goto LAB_00a2b71e;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x958,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar5) goto LAB_00a2bf64;
      *puVar9 = 0;
    }
LAB_00a2b71e:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x961,
                                "((args.Info.Count == 5 && (TaggedInt::Is(args[1]) || JavascriptNumber::Is(args[1])) && DynamicObject::IsBaseDynamicObject(args[2]) && VarIs<JavascriptBoolean>(args[3]) && VarIs<JavascriptBoolean>(args[4])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar5) goto LAB_00a2bf64;
    *puVar9 = 0;
  }
  pvVar10 = Arguments::operator[]((Arguments *)local_70,1);
  pFVar4 = fmt;
  cachedUNumberFormat = (Var)JavascriptConversion::ToNumber(pvVar10,(ScriptContext *)fmt);
  pvVar10 = Arguments::operator[]((Arguments *)local_70,2);
  pDVar11 = UnsafeVarTo<Js::DynamicObject>(pvVar10);
  pvVar10 = Arguments::operator[]((Arguments *)local_70,3);
  pJVar12 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar10);
  iVar1 = pJVar12->value;
  pvVar10 = Arguments::operator[]((Arguments *)local_70,4);
  pJVar12 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar10);
  iVar2 = pJVar12->value;
  args.Values = (Type)0x0;
  iVar6 = (*(pDVar11->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x14])(pDVar11,pDVar11,10,&args.Values,0,pFVar4);
  if (iVar6 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x968,
                                "(state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, __null, scriptContext))"
                                ,
                                "state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, __null, scriptContext)"
                               );
    if (!bVar5) goto LAB_00a2bf64;
    *puVar9 = 0;
  }
  if (iVar2 == 0) {
    if (iVar1 != 0) {
      Output::Trace(IntlPhase,L"%S(): Calling NumberFormat.prototype.formatToParts(%f)\n",
                    cachedUNumberFormat,"EntryIntl_FormatNumber");
      goto LAB_00a2b8ab;
    }
    Output::Trace(IntlPhase,L"%S(): Calling NumberFormat.prototype.format(%f)\n",cachedUNumberFormat
                  ,"EntryIntl_FormatNumber");
  }
  else {
    Output::Trace(IntlPhase,L"%S(): Calling %f.toLocaleString(...)\n",cachedUNumberFormat,
                  "EntryIntl_FormatNumber");
    if (iVar1 != 0) {
LAB_00a2b8ab:
      nfpb.fields.ptr._4_4_ = 0;
      num = (double)args.Values;
      local_40.object = (UFieldPositionIterator *)ufieldpositer_open_70();
      local_78 = &local_40;
      pRVar16 = (Recycler *)
                fmt[0x120].super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject;
      _auStack_88 = (FinalizableUNumberFormat **)&num;
      _partStart = &cachedUNumberFormat;
      fpi.object._4_4_ = 0;
      local_b8 = (undefined1  [8])&char16_t::typeinfo;
      nfpb.num = 0.0;
      nfpb.formatted.ptr = (char16_t *)0x8;
      nfpb._16_8_ = anon_var_dwarf_65688cc;
      nfpb.sc.ptr._0_4_ = 0x159;
      pRVar14 = Memory::Recycler::TrackAllocInfo(pRVar16,(TrackAllocData *)local_b8);
      pUVar15 = (UChar *)new__<Memory::Recycler>(0x10,pRVar14,0x37fe86);
      cVar7 = EntryIntl_FormatNumber::anon_class_24_3_faf3587d::operator()
                        ((anon_class_24_3_faf3587d *)auStack_88,pUVar15,8,
                         (UErrorCode *)((long)&fpi.object + 4));
      if ((int)cVar7 < 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x15b,
                                    "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)"
                                    ,
                                    "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0"
                                   );
        if (!bVar5) goto LAB_00a2bf64;
        *puVar9 = 0;
      }
      if ((fpi.object._4_4_ == 0xf) || (fpi.object._4_4_ == -0x7c)) {
        if ((int)cVar7 < 8) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x15e,"(*returnLength >= firstTryLength)",
                                      "Executor reported buffer failure but did not require additional space"
                                     );
          if (!bVar5) goto LAB_00a2bf64;
          *puVar9 = 0;
        }
        uVar19 = cVar7 + 1;
        Output::Trace(IntlPhase,
                      L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n"
                      ,"EnsureBuffer",8,(ulong)uVar19);
        fpi.object._4_4_ = 0;
        local_b8 = (undefined1  [8])&char16_t::typeinfo;
        nfpb.num = 0.0;
        nfpb._16_8_ = anon_var_dwarf_65688cc;
        nfpb.sc.ptr._0_4_ = 0x162;
        nfpb.formatted.ptr = (char16_t *)(long)(int)uVar19;
        pRVar16 = Memory::Recycler::TrackAllocInfo(pRVar16,(TrackAllocData *)local_b8);
        pUVar15 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                            ((Memory *)pRVar16,(Recycler *)Memory::Recycler::AllocLeaf,0,
                             (size_t)(long)(int)uVar19);
        cVar8 = EntryIntl_FormatNumber::anon_class_24_3_faf3587d::operator()
                          ((anon_class_24_3_faf3587d *)auStack_88,pUVar15,uVar19,
                           (UErrorCode *)((long)&fpi.object + 4));
        if (cVar8 != cVar7) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x164,"(*returnLength == secondTryLength - 1)",
                                      "Second try of executor returned unexpected length");
          cVar7 = cVar8;
          goto joined_r0x00a2badf;
        }
      }
      else if (7 < (int)cVar7) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x168,"(*returnLength < firstTryLength)",
                                    "Executor required additional length but reported successful status"
                                   );
joined_r0x00a2badf:
        if (!bVar5) goto LAB_00a2bf64;
        *puVar9 = 0;
      }
      if (fpi.object._4_4_ < 1 && fpi.object._4_4_ != -0x7c) {
LAB_00a2bbac:
        NumberFormatPartsBuilder::NumberFormatPartsBuilder
                  ((NumberFormatPartsBuilder *)local_b8,(double)cachedUNumberFormat,pUVar15,cVar7,
                   (ScriptContext *)fmt);
        _auStack_88 = (FinalizableUNumberFormat **)((ulong)_auStack_88 & 0xffffffff00000000);
        fpi.object._4_4_ = 0;
        field = ufieldpositer_next_70(local_40.object);
        while (-1 < (int)field) {
          NumberFormatPartsBuilder::InsertPart
                    ((NumberFormatPartsBuilder *)local_b8,field,(int)auStack_88,fpi.object._4_4_);
          field = ufieldpositer_next_70
                            (local_40.object,auStack_88,(undefined1 *)((long)&fpi.object + 4));
        }
        pJVar13 = NumberFormatPartsBuilder::ToPartsArray((NumberFormatPartsBuilder *)local_b8);
        PlatformAgnostic::ICUHelpers::
        ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70>::~ScopedICUObject
                  (&local_40);
        return pJVar13;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      pCVar17 = (LPCSTR)u_errorName_70(fpi.object._4_4_);
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x16b,
                                  "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                  ,pCVar17);
      if (bVar5) {
        *puVar9 = 0;
        goto LAB_00a2bbac;
      }
      goto LAB_00a2bf64;
    }
  }
  pRVar16 = (Recycler *)
            fmt[0x120].super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject;
  _auStack_88 = (FinalizableUNumberFormat **)&num;
  local_40.object = (UFieldPositionIterator *)((ulong)local_40.object._4_4_ << 0x20);
  _partStart = &cachedUNumberFormat;
  local_b8 = (undefined1  [8])&char16_t::typeinfo;
  nfpb.num = 0.0;
  nfpb.formatted.ptr = (char16_t *)0x8;
  nfpb._16_8_ = anon_var_dwarf_65688cc;
  nfpb.sc.ptr._0_4_ = 0x159;
  num = (double)args.Values;
  pRVar14 = Memory::Recycler::TrackAllocInfo(pRVar16,(TrackAllocData *)local_b8);
  pUVar15 = (UChar *)new__<Memory::Recycler>(0x10,pRVar14,0x37fe86);
  cVar7 = EntryIntl_FormatNumber::anon_class_16_2_4419d882::operator()
                    ((anon_class_16_2_4419d882 *)auStack_88,pUVar15,8,(UErrorCode *)&local_40);
  if ((int)cVar7 < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x15b,
                                "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)",
                                "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0");
    if (!bVar5) goto LAB_00a2bf64;
    *puVar9 = 0;
  }
  if (((int)local_40.object == 0xf) || ((int)local_40.object == -0x7c)) {
    if ((int)cVar7 < 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15e,"(*returnLength >= firstTryLength)",
                                  "Executor reported buffer failure but did not require additional space"
                                 );
      if (!bVar5) goto LAB_00a2bf64;
      *puVar9 = 0;
    }
    uVar19 = cVar7 + 1;
    Output::Trace(IntlPhase,
                  L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                  "EnsureBuffer",8,(ulong)uVar19);
    local_40.object = local_40.object & 0xffffffff00000000;
    local_b8 = (undefined1  [8])&char16_t::typeinfo;
    nfpb.num = 0.0;
    nfpb._16_8_ = anon_var_dwarf_65688cc;
    nfpb.sc.ptr._0_4_ = 0x162;
    nfpb.formatted.ptr = (char16_t *)(long)(int)uVar19;
    pRVar16 = Memory::Recycler::TrackAllocInfo(pRVar16,(TrackAllocData *)local_b8);
    pUVar15 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                        ((Memory *)pRVar16,(Recycler *)Memory::Recycler::AllocLeaf,0,
                         (size_t)(long)(int)uVar19);
    cVar8 = EntryIntl_FormatNumber::anon_class_16_2_4419d882::operator()
                      ((anon_class_16_2_4419d882 *)auStack_88,pUVar15,uVar19,(UErrorCode *)&local_40
                      );
    if (cVar8 != cVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x164,"(*returnLength == secondTryLength - 1)",
                                  "Second try of executor returned unexpected length");
      cVar7 = cVar8;
      goto joined_r0x00a2be74;
    }
  }
  else if (7 < (int)cVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x168,"(*returnLength < firstTryLength)",
                                "Executor required additional length but reported successful status"
                               );
joined_r0x00a2be74:
    if (!bVar5) goto LAB_00a2bf64;
    *puVar9 = 0;
  }
  if (0 < (int)local_40.object || (int)local_40.object == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    pCVar17 = (LPCSTR)u_errorName_70((ulong)local_40.object & 0xffffffff);
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar17);
    if (!bVar5) {
LAB_00a2bf64:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  pJVar18 = JavascriptString::NewWithBuffer(pUVar15,cVar7,(ScriptContext *)fmt);
  return pJVar18;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_FormatNumber(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#if defined(INTL_ICU)
        INTL_CHECK_ARGS(
            args.Info.Count == 5 &&
            (TaggedInt::Is(args[1]) || JavascriptNumber::Is(args[1])) &&
            DynamicObject::IsBaseDynamicObject(args[2]) &&
            VarIs<JavascriptBoolean>(args[3]) &&
            VarIs<JavascriptBoolean>(args[4])
        );

        double num = JavascriptConversion::ToNumber(args[1], scriptContext);
        DynamicObject *state = UnsafeVarTo<DynamicObject>(args[2]);
        bool toParts = UnsafeVarTo<JavascriptBoolean>(args[3])->GetValue();
        bool forNumberPrototypeToLocaleString = UnsafeVarTo<JavascriptBoolean>(args[4])->GetValue();
        Var cachedUNumberFormat = nullptr; // cached by EntryIntl_CacheNumberFormat
        AssertOrFailFast(state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, NULL, scriptContext));

        if (forNumberPrototypeToLocaleString)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Number_Prototype_toLocaleString);
            INTL_TRACE("Calling %f.toLocaleString(...)", num);
        }
        else if (toParts)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(NumberFormat_Prototype_formatToParts);
            INTL_TRACE("Calling NumberFormat.prototype.formatToParts(%f)", num);
        }
        else
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(NumberFormat_Prototype_format);
            INTL_TRACE("Calling NumberFormat.prototype.format(%f)", num);
        }

        auto fmt = static_cast<FinalizableUNumberFormat *>(cachedUNumberFormat);
        char16 *formatted = nullptr;
        int formattedLen = 0;

        if (!toParts)
        {
            EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
            {
                return unum_formatDouble(*fmt, num, buf, bufLen, nullptr, status);
            }, scriptContext->GetRecycler(), &formatted, &formattedLen);

            return JavascriptString::NewWithBuffer(formatted, formattedLen, scriptContext);
        }

#if defined(ICU_VERSION) && ICU_VERSION >= 61
        UErrorCode status = U_ZERO_ERROR;
        ScopedUFieldPositionIterator fpi(ufieldpositer_open(&status));

        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return unum_formatDoubleForFields(*fmt, num, buf, bufLen, fpi, status);
        }, scriptContext->GetRecycler(), &formatted, &formattedLen);

        NumberFormatPartsBuilder nfpb(num, formatted, formattedLen, scriptContext);

        int partStart = 0;
        int partEnd = 0;
        int i = 0;
        for (int kind = ufieldpositer_next(fpi, &partStart, &partEnd); kind >= 0; kind = ufieldpositer_next(fpi, &partStart, &partEnd), ++i)
        {
            nfpb.InsertPart(static_cast<UNumberFormatFields>(kind), partStart, partEnd);
        }

        return nfpb.ToPartsArray();
#else
        JavascriptLibrary *library = scriptContext->GetLibrary();
        JavascriptArray *ret = library->CreateArray(1);
        DynamicObject* part = library->CreateObject();
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return unum_formatDouble(*fmt, num, buf, bufLen, nullptr, status);
        }, scriptContext->GetRecycler(), &formatted, &formattedLen);
        JavascriptOperators::InitProperty(part, PropertyIds::type, library->GetIntlUnknownPartString());
        JavascriptOperators::InitProperty(part, PropertyIds::value, JavascriptString::NewWithBuffer(formatted, formattedLen, scriptContext));

        ret->SetItem(0, part, PropertyOperationFlags::PropertyOperation_None);
        return ret;
#endif // #if ICU_VERSION >= 61 ... #else
#else
        INTL_CHECK_ARGS(
            args.Info.Count == 3 &&
            (TaggedInt::Is(args.Values[1]) || JavascriptNumber::Is(args.Values[1])) &&
            DynamicObject::IsBaseDynamicObject(args.Values[2])
        );

        DynamicObject *options = VarTo<DynamicObject>(args.Values[2]);
        Var hiddenObject = nullptr;
        AssertOrFailFastMsg(options->GetInternalProperty(options, Js::InternalPropertyIds::HiddenObject, &hiddenObject, NULL, scriptContext),
            "EntryIntl_FormatNumber: Could not retrieve hiddenObject.");
        DelayLoadWindowsGlobalization* wsl = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary();

        NumberFormatting::INumberFormatter *numberFormatter;
        numberFormatter = static_cast<NumberFormatting::INumberFormatter *>(((AutoCOMJSObject *)hiddenObject)->GetInstance());

        AutoHSTRING result;
        HRESULT hr;
        if (TaggedInt::Is(args.Values[1]))
        {
            IfFailThrowHr(numberFormatter->FormatInt(TaggedInt::ToInt32(args.Values[1]), &result));
        }
        else
        {
            IfFailThrowHr(numberFormatter->FormatDouble(JavascriptNumber::GetValue(args.Values[1]), &result));
        }

        PCWSTR strBuf = wsl->WindowsGetStringRawBuffer(*result, NULL);

        if (strBuf == nullptr)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
        else
        {
            JavascriptStringObject *retVal = scriptContext->GetLibrary()->CreateStringObject(Js::JavascriptString::NewCopySz(strBuf, scriptContext));
            return retVal;
        }
#endif
    }